

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int parse_range_header(mg_str *header,int64_t *a,int64_t *b)

{
  size_t __n;
  int iVar1;
  void *__dest;
  
  __n = header->len;
  __dest = malloc(__n + 1);
  if (__dest == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    memcpy(__dest,header->p,__n);
    *(undefined1 *)((long)__dest + __n) = 0;
    iVar1 = __isoc99_sscanf(__dest,"bytes=%ld-%ld",a,b);
    free(__dest);
  }
  return iVar1;
}

Assistant:

static int parse_range_header(const struct mg_str *header, int64_t *a,
                              int64_t *b) {
    /*
   * There is no snscanf. Headers are not guaranteed to be NUL-terminated,
   * so we have this. Ugh.
   */
    int result;
    char *p = (char *) MG_MALLOC(header->len + 1);
    if (p == NULL) return 0;
    memcpy(p, header->p, header->len);
    p[header->len] = '\0';
    result = sscanf(p, "bytes=%" INT64_FMT "-%" INT64_FMT, a, b);
    MG_FREE(p);
    return result;
}